

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

size_t jessilib::array_start_action<char32_t,jessilib::json_context<char32_t,true>>
                 (json_context<char32_t,_true> *inout_context,
                 basic_string_view<char32_t,_std::char_traits<char32_t>_> *inout_read_view)

{
  char32_t cVar1;
  char32_t *pcVar2;
  size_t sVar3;
  bool bVar4;
  size_t sVar5;
  invalid_argument *piVar6;
  size_t sVar7;
  char32_t *pcVar8;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *args_1;
  ulong uVar9;
  vector<jessilib::object,_std::allocator<jessilib::object>_> result;
  object obj;
  vector<jessilib::object,_std::allocator<jessilib::object>_> local_c8;
  string local_a8;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_88;
  undefined1 local_58;
  undefined8 local_40;
  char8_t *local_38;
  
  local_c8.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar5 = inout_read_view->_M_len;
  if (sVar5 != 0) {
    pcVar2 = inout_read_view->_M_str;
    do {
      sVar5 = sVar5 - 1;
      pcVar8 = pcVar2 + 1;
      cVar1 = *pcVar2;
      if ((0x20 < (ulong)(uint)cVar1) || ((0x100002600U >> ((ulong)(uint)cVar1 & 0x3f) & 1) == 0)) {
        if (cVar1 == L']') {
          inout_read_view->_M_str = pcVar8;
          inout_read_view->_M_len = sVar5;
          std::
          variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
          ::emplace<6ul,std::vector<jessilib::object,std::allocator<jessilib::object>>>
                    ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
                      *)inout_context->out_object,&local_c8);
          goto LAB_001f98cb;
        }
        goto LAB_001f97ec;
      }
      inout_read_view->_M_str = pcVar8;
      inout_read_view->_M_len = sVar5;
      pcVar2 = pcVar8;
    } while (sVar5 != 0);
  }
  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar6,
             "Invalid JSON data: unexpected end of data when parsing object array; expected \']\'");
  goto LAB_001f9910;
LAB_001f97ec:
  do {
    local_88._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
    local_58 = 0;
    bVar4 = deserialize_json<char32_t,_true,_&jessilib::fail_action>
                      ((object *)&local_88._M_first,inout_read_view);
    if (!bVar4) {
LAB_001f98ea:
      std::__detail::__variant::
      _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                           *)&local_88._M_first);
      break;
    }
    std::vector<jessilib::object,_std::allocator<jessilib::object>_>::emplace_back<jessilib::object>
              (&local_c8,(object *)&local_88._M_first);
    sVar5 = inout_read_view->_M_len;
    if (sVar5 == 0) goto LAB_001f98ea;
    args_1 = (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)
             (inout_read_view->_M_str + 2);
    sVar7 = sVar5 - 2;
    pcVar2 = inout_read_view->_M_str;
    while( true ) {
      pcVar8 = pcVar2 + 1;
      sVar5 = sVar5 - 1;
      uVar9 = (ulong)(uint)*pcVar2;
      if (0x2c < uVar9) goto LAB_001f98aa;
      if ((0x100002600U >> (uVar9 & 0x3f) & 1) == 0) break;
      inout_read_view->_M_str = pcVar8;
      inout_read_view->_M_len = sVar5;
      args_1 = (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)
               ((long)&args_1->_M_len + 4);
      sVar7 = sVar7 - 1;
      pcVar2 = pcVar8;
      if (sVar5 == 0) goto LAB_001f98ea;
    }
    if (uVar9 != 0x2c) {
LAB_001f98aa:
      if (*pcVar2 != L']') {
        piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_40 = 0x3d;
        local_38 = "Invalid JSON data: expected \',\' or \']\', instead encountered: ";
        join_mbstring<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char32_t,std::char_traits<char32_t>>&>
                  (&local_a8,(jessilib *)&local_40,
                   (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)inout_read_view,args_1)
        ;
        std::invalid_argument::invalid_argument(piVar6,(string *)&local_a8);
        __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      inout_read_view->_M_str = pcVar8;
      inout_read_view->_M_len = sVar5;
      std::
      variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
      ::emplace<6ul,std::vector<jessilib::object,std::allocator<jessilib::object>>>
                ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
                  *)inout_context->out_object,&local_c8);
      std::__detail::__variant::
      _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                           *)&local_88._M_first);
LAB_001f98cb:
      std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector(&local_c8);
      return 1;
    }
    inout_read_view->_M_str = pcVar8;
    inout_read_view->_M_len = sVar5;
    while (((sVar3 = sVar7, sVar5 != 0 &&
            (uVar9 = (ulong)*(uint *)((long)&args_1[-1]._M_str + 4), uVar9 < 0x21)) &&
           ((0x100002600U >> (uVar9 & 0x3f) & 1) != 0))) {
      inout_read_view->_M_str = (char32_t *)args_1;
      inout_read_view->_M_len = sVar3;
      args_1 = (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)
               ((long)&args_1->_M_len + 4);
      sVar7 = sVar3 - 1;
      sVar5 = sVar3;
    }
    std::__detail::__variant::
    _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
    ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                         *)&local_88._M_first);
  } while (inout_read_view->_M_len != 0);
  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar6,
             "Invalid JSON data: unexpected end of data when parsing object array; expected \']\'");
LAB_001f9910:
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

constexpr syntax_tree_member<CharT, ContextT> make_keyword_value_pair() {
	// null, true, false
	return { InCodepointV, [](ContextT& inout_context, std::basic_string_view<CharT>& inout_read_view) constexpr -> size_t {
		if (starts_with_fast(inout_read_view, KeywordRemainderV)) {
			// This is the keyword; go ahead and chuck it in
			if constexpr (std::is_pointer_v<ValueT> || std::is_null_pointer_v<ValueT>) {
				if constexpr (ValueV == nullptr) {
					inout_context.out_object = object{};
				}
			}
			else {
				inout_context.out_object = ValueV;
			}
			inout_read_view.remove_prefix(KeywordRemainderV.size());
			return 1;
		}

		// Unexpected character; throw if appropriate
		if constexpr (ContextT::use_exceptions) {
			using namespace std::literals;
			throw std::invalid_argument{ jessilib::join_mbstring(u8"Invalid JSON data; unexpected token: '"sv,
				inout_read_view,
				u8"' when parsing null"sv) };
		}

		return std::numeric_limits<size_t>::max();
	} };
}